

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

ggml_status ggml_tallocr_alloc(ggml_tallocr *talloc,ggml_tensor *tensor)

{
  long lVar1;
  int64_t *piVar2;
  ggml_status gVar3;
  size_t sVar4;
  ggml_tensor *tensor_00;
  void *pvVar5;
  ggml_backend_buffer_t in_RSI;
  undefined8 *in_RDI;
  void *addr;
  size_t size;
  ggml_tensor *in_stack_ffffffffffffffc8;
  _func__Bool_ggml_backend_buffer_t_ggml_tensor_ptr_ggml_tensor_ptr **pp_Var6;
  ggml_backend_buffer_t in_stack_ffffffffffffffd0;
  
  sVar4 = ggml_backend_buffer_get_alloc_size(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  tensor_00 = (ggml_tensor *)((sVar4 + in_RDI[2]) - 1 & (in_RDI[2] - 1 ^ 0xffffffffffffffff));
  lVar1 = in_RDI[3];
  piVar2 = tensor_00->ne;
  sVar4 = ggml_backend_buffer_get_size((ggml_backend_buffer_t)*in_RDI);
  if (sVar4 < (ulong)((long)piVar2 + lVar1 + -0x10)) {
    pp_Var6 = &in_RSI[2].iface.cpy_tensor;
    sVar4 = ggml_backend_buffer_get_size((ggml_backend_buffer_t)*in_RDI);
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,
                      "%s: not enough space in the buffer to allocate %s (needed %zu, available %zu)\n"
                      ,"ggml_tallocr_alloc",pp_Var6,tensor_00,sVar4 - in_RDI[3]);
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,99,"not enough space in the buffer");
  }
  pvVar5 = ggml_backend_buffer_get_base((ggml_backend_buffer_t)in_stack_ffffffffffffffc8);
  lVar1 = in_RDI[3];
  in_RDI[3] = (long)tensor_00->ne + in_RDI[3] + -0x10;
  gVar3 = ggml_backend_tensor_alloc(in_RSI,tensor_00,(void *)((long)pvVar5 + lVar1));
  return gVar3;
}

Assistant:

enum ggml_status ggml_tallocr_alloc(struct ggml_tallocr * talloc, struct ggml_tensor * tensor) {
    size_t size = ggml_backend_buffer_get_alloc_size(talloc->buffer, tensor);
    size = GGML_PAD(size, talloc->alignment);

    if (talloc->offset + size > ggml_backend_buffer_get_size(talloc->buffer)) {
        GGML_LOG_ERROR("%s: not enough space in the buffer to allocate %s (needed %zu, available %zu)\n",
                __func__, tensor->name, size, ggml_backend_buffer_get_size(talloc->buffer) - talloc->offset);
        GGML_ABORT("not enough space in the buffer");
    }

    void * addr = (char *)ggml_backend_buffer_get_base(talloc->buffer) + talloc->offset;
    talloc->offset += size;

    assert(((uintptr_t)addr % talloc->alignment) == 0);

    return ggml_backend_tensor_alloc(talloc->buffer, tensor, addr);
}